

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_0::ArrayComparisonTest<const_double,_const_double>::ArrayComparisonTest
          (ArrayComparisonTest<const_double,_const_double> *this,initializer_list<const_double> left
          ,initializer_list<const_double> right,TestOrdering expectedResult)

{
  kj *this_00;
  kj *end;
  
  this_00 = (kj *)right._M_array;
  end = this_00;
  heapArray<double_const,double_const*>
            (&this->left,(kj *)left._M_array,(double *)((kj *)left._M_array + left._M_len * 8),
             (double *)this_00);
  heapArray<double_const,double_const*>(&this->right,this_00,(double *)(this_00 + 8),(double *)end);
  this->expectedResult = (TestOrdering)right._M_len;
  return;
}

Assistant:

ArrayComparisonTest(std::initializer_list<A> left, std::initializer_list<B> right, TestOrdering expectedResult) :
    left(heapArray(left)), right(heapArray(right)), expectedResult(expectedResult) {}